

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O3

bool __thiscall BoolLinearLE<0>::propagate(BoolLinearLE<0> *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  BoolView *pBVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  IntVar *pIVar8;
  ulong uVar9;
  int *pt;
  long lVar10;
  TrailElem local_38;
  
  pIVar8 = (this->y).var;
  iVar1 = (pIVar8->max).v;
  iVar2 = (this->ones).v;
  iVar5 = iVar2;
  if (iVar1 < iVar2) {
    iVar5 = iVar1 + 1;
    local_38.sz = 4;
    local_38.pt = &(this->ones).v;
    local_38.x = iVar2;
    vec<TrailElem>::push(&engine.trail,&local_38);
    (this->ones).v = iVar5;
    pIVar8 = (this->y).var;
  }
  if ((pIVar8->min).v < iVar5) {
    iVar5 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar8,(long)iVar5,(ulong)(uint)(this->super_Propagator).prop_id << 0x20 | 5,
                       1);
    if ((char)iVar5 == '\0') {
      return false;
    }
    iVar5 = (this->ones).v;
  }
  if ((iVar5 == iVar1) && (uVar6 = (this->x).sz, uVar6 != 0)) {
    lVar10 = 0xc;
    uVar9 = 0;
    pcVar7 = sat.assigns.data;
    do {
      pBVar4 = (this->x).data;
      uVar3 = *(uint *)((long)pBVar4 + lVar10 + -4);
      if (pcVar7[uVar3] == '\0') {
        SAT::enqueue(&sat,(Lit)((*(byte *)((long)&(pBVar4->super_Var).super_Branching.
                                                  _vptr_Branching + lVar10) ^ 1) + uVar3 * 2),
                     (Reason)(((ulong)(uint)(this->super_Propagator).prop_id << 0x20) + 1));
        uVar6 = (this->x).sz;
        pcVar7 = sat.assigns.data;
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x10;
    } while (uVar9 < uVar6);
  }
  return true;
}

Assistant:

bool propagate() override {
		const int y_max = static_cast<int>(y.getMax());

		if (ones > y_max) {
			ones = y_max + 1;
		}

		setDom2(y, setMin, ones, 1);

		if (ones == y_max) {
			for (unsigned int i = 0; i < x.size(); i++) {
				if (!x[i].isFixed()) {
					x[i].setVal2(false, Reason(prop_id, 0));
				}
			}
		}

		return true;
	}